

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O1

void get_rgb_color(RK_U32 *R,RK_U32 *G,RK_U32 *B,RK_S32 x,RK_S32 y,RK_S32 frm_cnt)

{
  uint uVar1;
  RK_U32 RVar2;
  int iVar3;
  RK_U32 RVar4;
  RK_U32 RVar5;
  int iVar6;
  RK_U32 RVar7;
  
  if (frm_cnt == 2) {
    *R = 0;
    *G = 0;
    RVar4 = 0xff;
  }
  else {
    if (frm_cnt == 1) {
      *R = 0;
      *G = 0xff;
    }
    else {
      if (frm_cnt != 0) {
        uVar1 = frm_cnt * 3 + y + x & 0xff;
        iVar6 = (((uint)(x - (x >> 0x1f)) >> 1) + frm_cnt * 5 + 0x40 & 0xff) - 0x80;
        RVar5 = (iVar6 * 0x168 >> 8) + uVar1;
        iVar3 = (((uint)(y - (y >> 0x1f)) >> 1 ^ 0x80) + frm_cnt * 2 & 0xff) - 0x80;
        RVar4 = (iVar3 * 0x1c7 >> 8) + uVar1;
        RVar2 = uVar1 - (iVar6 * 0xb8 + iVar3 * 0x58 >> 8);
        if (0xfe < (int)RVar5) {
          RVar5 = 0xff;
        }
        RVar7 = 0;
        if ((int)RVar5 < 1) {
          RVar5 = RVar7;
        }
        if (0xfe < (int)RVar2) {
          RVar2 = 0xff;
        }
        if ((int)RVar2 < 1) {
          RVar2 = RVar7;
        }
        *R = RVar5;
        if (0xfe < (int)RVar4) {
          RVar4 = 0xff;
        }
        *G = RVar2;
        if ((int)RVar4 < 1) {
          RVar4 = RVar7;
        }
        goto LAB_00109d94;
      }
      *R = 0xff;
      *G = 0;
    }
    RVar4 = 0;
  }
LAB_00109d94:
  *B = RVar4;
  return;
}

Assistant:

static void get_rgb_color(RK_U32 *R, RK_U32 *G, RK_U32 *B, RK_S32 x, RK_S32 y, RK_S32 frm_cnt)
{
    // frame 0 -> red
    if (frm_cnt == 0) {
        R[0] = 0xff;
        G[0] = 0;
        B[0] = 0;
        return ;
    }

    // frame 1 -> green
    if (frm_cnt == 1) {
        R[0] = 0;
        G[0] = 0xff;
        B[0] = 0;
        return ;
    }

    // frame 2 -> blue
    if (frm_cnt == 2) {
        R[0] = 0;
        G[0] = 0;
        B[0] = 0xff;
        return ;
    }

    // moving color bar
    RK_U8 Y = (0   +  x + y  + frm_cnt * 3);
    RK_U8 U = (128 + (y / 2) + frm_cnt * 2);
    RK_U8 V = (64  + (x / 2) + frm_cnt * 5);

    RK_S32 _R = Y + ((360 * (V - 128)) >> 8);
    RK_S32 _G = Y - (((88 * (U - 128) + 184 * (V - 128))) >> 8);
    RK_S32 _B = Y + ((455 * (U - 128)) >> 8);

    R[0] = MPP_CLIP3(0, 255, _R);
    G[0] = MPP_CLIP3(0, 255, _G);
    B[0] = MPP_CLIP3(0, 255, _B);
}